

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.cpp
# Opt level: O1

void idx2::CallocBuf(buffer *Buf,i64 Bytes,allocator *Alloc)

{
  byte *pbVar1;
  idx2 *this;
  printer Pr;
  idx2 local_30 [24];
  
  if (Mallocator()::Instance == '\0') {
    CallocBuf();
  }
  if (Alloc == (allocator *)&Mallocator()::Instance) {
    pbVar1 = (byte *)calloc(Bytes,1);
    Buf->Data = pbVar1;
  }
  else {
    (**Alloc->_vptr_allocator)(Alloc,Buf,Bytes);
    memset(Buf->Data,0,Buf->Bytes);
  }
  if (Buf->Data != (byte *)0x0) {
    Buf->Bytes = Bytes;
    Buf->Alloc = Alloc;
    return;
  }
  this = local_30;
  CallocBuf(this);
  (**(code **)(**(long **)(this + 0x10) + 8))(*(long **)(this + 0x10),this);
  return;
}

Assistant:

void
CallocBuf(buffer* Buf, i64 Bytes, allocator* Alloc)
{
  idx2_Assert(!Buf->Data || Buf->Bytes == 0, "Buffer not freed before allocating new memory");
  if (Alloc == &Mallocator())
  {
    Buf->Data = (byte*)calloc(size_t(Bytes), 1);
  }
  else
  {
    AllocBuf(Buf, Bytes, Alloc);
    ZeroBuf(Buf);
  }
  idx2_AbortIf(!(Buf->Data), "Out of memory");
  Buf->Bytes = Bytes;
  Buf->Alloc = Alloc;
}